

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# base_rock_sample.cpp
# Opt level: O0

BeliefUpperBound * __thiscall
despot::BaseRockSample::CreateBeliefUpperBound(BaseRockSample *this,string *name)

{
  bool bVar1;
  ostream *poVar2;
  string *name_local;
  BaseRockSample *this_local;
  
  bVar1 = std::operator==(name,"TRIVIAL");
  if (bVar1) {
    this_local = (BaseRockSample *)operator_new(0x10);
    despot::TrivialBeliefUpperBound::TrivialBeliefUpperBound
              ((TrivialBeliefUpperBound *)this_local,(DSPOMDP *)&this->super_BeliefMDP);
  }
  else {
    bVar1 = std::operator==(name,"DEFAULT");
    if (!bVar1) {
      bVar1 = std::operator==(name,"MDP");
      if (!bVar1) {
        poVar2 = std::operator<<((ostream *)&std::cerr,"Unsupported belief lower bound: ");
        poVar2 = std::operator<<(poVar2,(string *)name);
        std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
        exit(1);
      }
    }
    this_local = (BaseRockSample *)operator_new(0x28);
    RockSampleMDPBeliefUpperBound::RockSampleMDPBeliefUpperBound
              ((RockSampleMDPBeliefUpperBound *)this_local,this);
  }
  return (BeliefUpperBound *)this_local;
}

Assistant:

BeliefUpperBound* BaseRockSample::CreateBeliefUpperBound(string name) const {
	if (name == "TRIVIAL") {
		return new TrivialBeliefUpperBound(this);
	} else if (name == "DEFAULT" || name == "MDP") {
		return new RockSampleMDPBeliefUpperBound(this);
	} else {
		cerr << "Unsupported belief lower bound: " << name << endl;
		exit(1);
		return NULL;
	}
}